

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

pair<const_llvm::ConstantInt_*,_dg::vr::Relations>
dg::vr::RelationsAnalyzer::getBoundOnPointedToValue
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *changeLocations,VectorSet<const_llvm::Value_*> *froms,Relation rel)

{
  bool bVar1;
  _WordT *p_Var2;
  Type in_EDX;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> valueRels;
  Handle pointedTo;
  HandlePtr from;
  ValueRelations *graph;
  VRLocation *loc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *__range2;
  Relations current;
  C bound;
  undefined4 in_stack_ffffffffffffff58;
  Type in_stack_ffffffffffffff5c;
  ValueRelations *in_stack_ffffffffffffff60;
  undefined1 local_98 [4];
  Type in_stack_ffffffffffffff6c;
  C in_stack_ffffffffffffff70;
  ValueRelations *local_88;
  Handle in_stack_ffffffffffffff88;
  ValueRelations *in_stack_ffffffffffffff90;
  __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
  local_48 [2];
  _Base_bitset<1UL> local_38;
  ValueRelations *local_30;
  Type local_24;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_10;
  
  local_30 = (ValueRelations *)0x0;
  local_38._M_w = allRelations;
  local_24 = in_EDX;
  local_48[0]._M_current =
       (VRLocation **)
       std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::begin
                 ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *
                  )CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::end
            ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar1) {
      std::pair<const_llvm::ConstantInt_*,_dg::vr::Relations>::
      pair<const_llvm::ConstantInt_*&,_dg::vr::Relations_&,_true>
                (&local_10,(ConstantInt **)&local_30,(Relations *)&local_38);
      return local_10;
    }
    __gnu_cxx::
    __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
    ::operator*(local_48);
    getCorrespondingByContent
              ((ValueRelations *)in_stack_ffffffffffffff88,
               (VectorSet<const_llvm::Value_*> *)local_88._8_8_);
    bVar1 = ValueRelations::hasLoad<dg::vr::Bucket>
                      (in_stack_ffffffffffffff60,
                       (Bucket *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar1) {
      std::pair<const_llvm::ConstantInt_*,_dg::vr::Relations>::
      pair<std::nullptr_t,_dg::vr::Relations_&,_true>
                (&local_10,(void **)&stack0xffffffffffffff90,(Relations *)&local_38);
      return local_10;
    }
    in_stack_ffffffffffffff88 =
         ValueRelations::getPointedTo<dg::vr::Bucket>
                   (in_stack_ffffffffffffff60,
                    (Bucket *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    _local_88 = ValueRelations::getBound<dg::vr::Bucket>
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,local_88._12_4_);
    if (local_88 == (ValueRelations *)0x0) {
      std::pair<const_llvm::ConstantInt_*,_dg::vr::Relations>::
      pair<std::nullptr_t,_dg::vr::Relations_&,_true>
                (&local_10,(void **)&stack0xffffffffffffff70,(Relations *)&local_38);
      return local_10;
    }
    if (local_30 == (ValueRelations *)0x0) {
LAB_001d0d5b:
      local_30 = local_88;
      memset(local_98,0,8);
      Relations::Relations((Relations *)0x1d0d80);
      dg::vr::Relations::getStrict(local_24);
      Relations::set((Relations *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      p_Var2 = (_WordT *)dg::vr::Relations::addImplied();
      local_38._M_w = *p_Var2;
    }
    else {
      in_stack_ffffffffffffff60 = local_30;
      dg::vr::Relations::getStrict(local_24);
      bVar1 = ValueRelations::compare
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                         (C)in_stack_ffffffffffffff60);
      if (bVar1) goto LAB_001d0d5b;
    }
    Relations::operator&=
              ((Relations *)in_stack_ffffffffffffff60,
               (Relations *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    __gnu_cxx::
    __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
    ::operator++(local_48);
  } while( true );
}

Assistant:

std::pair<RelationsAnalyzer::C, Relations>
RelationsAnalyzer::getBoundOnPointedToValue(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, Relation rel) {
    C bound = nullptr;
    Relations current = allRelations;

    for (const VRLocation *loc : changeLocations) {
        const ValueRelations &graph = loc->relations;
        HandlePtr from = getCorrespondingByContent(graph, froms);
        assert(from);
        if (!graph.hasLoad(*from))
            return {nullptr, current};

        Handle pointedTo = graph.getPointedTo(*from);
        auto valueRels = graph.getBound(pointedTo, rel);

        if (!valueRels.first)
            return {nullptr, current};

        if (!bound || ValueRelations::compare(bound, Relations::getStrict(rel),
                                              valueRels.first)) {
            bound = valueRels.first;
            current = Relations().set(Relations::getStrict(rel)).addImplied();
        }

        current &= valueRels.second;
        assert(current.any());
    }
    return {bound, current};
}